

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLABecLaplacian::Fapply
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  double dVar1;
  double dVar2;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> this_00;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  MFIter mfi;
  ulong local_470;
  ulong local_428;
  Box local_354;
  double *local_338;
  ulong uStack_330;
  double *local_328;
  ulong uStack_320;
  Real local_310;
  long local_308;
  ulong local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  FabArray<amrex::FArrayBox> *local_2e0;
  FabArray<amrex::FArrayBox> *local_2d8;
  FabArray<amrex::FArrayBox> *local_2d0;
  FabArray<amrex::FArrayBox> *local_2c8;
  FabArray<amrex::FArrayBox> *local_2c0;
  MLABecLaplacian *local_2b8;
  FabArray<amrex::FArrayBox> *local_2b0;
  ulong local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  Array4<const_double> local_288;
  Array4<const_double> local_248;
  Array4<const_double> local_208;
  Array4<double> local_1c8;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  double local_108;
  ulong uStack_100;
  double local_f8;
  ulong uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  lVar16 = (long)amrlev;
  local_308 = (long)mglev;
  local_2c0 = (FabArray<amrex::FArrayBox> *)
              (local_308 * 0x180 +
              *(long *)&(this->m_a_coeffs).
                        super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar16].
                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
  lVar10 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar4 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar16].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar5 = local_308 * 200;
  local_328 = *(double **)(lVar4 + 0x38 + lVar5);
  uStack_320 = 0;
  local_338 = *(double **)(lVar4 + 0x40 + lVar5);
  uStack_330 = 0;
  dVar1 = *(double *)(lVar4 + 0x48 + lVar5);
  local_310 = this->m_a_scalar;
  dVar2 = this->m_b_scalar;
  local_2b8 = this;
  local_2b0 = &in->super_FabArray<amrex::FArrayBox>;
  uVar3 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_2c8 = &out->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&local_90,(FabArrayBase *)out,true);
  if (local_90.currentIndex < local_90.endIndex) {
    lVar4 = local_308 * 0x480;
    local_2d0 = (FabArray<amrex::FArrayBox> *)(lVar10 + lVar4);
    local_2d8 = (FabArray<amrex::FArrayBox> *)(lVar10 + lVar4 + 0x180);
    local_2e0 = (FabArray<amrex::FArrayBox> *)(lVar10 + 0x300 + lVar4);
    uStack_f0 = uStack_320 ^ 0x8000000000000000;
    local_f8 = -(double)local_328 * dVar2 * (double)local_328;
    uStack_100 = uStack_330 ^ 0x8000000000000000;
    local_108 = -(double)local_338 * dVar2 * (double)local_338;
    uStack_e0 = 0x8000000000000000;
    local_e8 = -dVar1 * dVar2 * dVar1;
    local_300 = (ulong)uVar3;
    local_2e8 = lVar16 * 3;
    do {
      MFIter::tilebox(&local_354,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_188,local_2b0,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1c8,local_2c8,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_148,local_2c0,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_208,local_2d0,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_248,local_2d8,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_288,local_2e0,&local_90);
      this_00._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &(&(((local_2b8->super_MLCellABecLap).m_overset_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)[local_2e8][local_308]._M_t;
      if ((__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
          this_00._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x0) {
        if (0 < (int)uVar3) {
          local_2a8 = (ulong)(uint)local_354.bigend.vect[2];
          local_298 = (ulong)(uint)local_354.bigend.vect[1];
          local_2f0 = (long)local_354.smallend.vect[1];
          local_2a0 = (long)local_354.smallend.vect[0] * 8;
          uVar13 = (local_354.bigend.vect[0] - local_354.smallend.vect[0]) + 1;
          local_290 = (ulong)uVar13;
          local_2f8 = 0;
          local_428 = 0;
          do {
            iVar12 = local_354.smallend.vect[2];
            if (local_354.smallend.vect[2] <= local_354.bigend.vect[2]) {
              do {
                if (local_354.smallend.vect[1] <= local_354.bigend.vect[1]) {
                  lVar8 = (long)local_188.begin.x;
                  lVar9 = local_188.kstride * 8;
                  lVar7 = local_188.nstride * local_2f8;
                  lVar4 = lVar9 * (iVar12 - local_188.begin.z) + lVar7 + lVar8 * -8 + local_2a0;
                  lVar5 = local_248.nstride * local_2f8 +
                          (iVar12 - local_248.begin.z) * local_248.kstride * 8 +
                          (long)local_248.begin.x * -8 + local_2a0;
                  lVar10 = local_188.jstride * 8;
                  lVar16 = local_2f0;
                  do {
                    if (local_354.smallend.vect[0] <= local_354.bigend.vect[0]) {
                      lVar15 = lVar16 - local_188.begin.y;
                      lVar11 = (lVar16 - local_208.begin.y) * local_208.jstride * 8 +
                               local_208.nstride * local_2f8 +
                               (iVar12 - local_208.begin.z) * local_208.kstride * 8 +
                               (long)local_208.begin.x * -8 + local_2a0;
                      local_328 = (double *)(lVar16 + 1);
                      lVar14 = (lVar16 - local_288.begin.y) * local_288.jstride * 8;
                      lVar17 = lVar15 * lVar10;
                      local_338 = (double *)
                                  ((long)local_188.p +
                                  lVar17 + (~local_188.begin.z + iVar12) * lVar9 + lVar7 +
                                           lVar8 * -8 + local_2a0);
                      lVar6 = 0;
                      do {
                        dVar1 = *(double *)((long)local_188.p + lVar6 * 8 + lVar17 + lVar4);
                        *(double *)
                         ((long)local_1c8.p +
                         lVar6 * 8 +
                         (lVar16 - local_1c8.begin.y) * local_1c8.jstride * 8 +
                         local_1c8.nstride * local_2f8 +
                         (iVar12 - local_1c8.begin.z) * local_1c8.kstride * 8 +
                         (long)local_1c8.begin.x * -8 + local_2a0) =
                             ((*(double *)
                                ((long)local_188.p +
                                lVar6 * 8 +
                                lVar17 + ((iVar12 + 1) - local_188.begin.z) * lVar9 + lVar7 +
                                         lVar8 * -8 + local_2a0) - dVar1) *
                              *(double *)
                               ((long)local_288.p +
                               lVar6 * 8 +
                               lVar14 + local_288.kstride * 8 *
                                        (long)((iVar12 + 1) - local_288.begin.z) +
                                        local_288.nstride * local_2f8 + (long)local_288.begin.x * -8
                                        + local_2a0) -
                             (dVar1 - local_338[lVar6]) *
                             *(double *)
                              ((long)local_288.p +
                              lVar6 * 8 +
                              lVar14 + (long)(iVar12 - local_288.begin.z) * local_288.kstride * 8 +
                                       local_288.nstride * local_2f8 + (long)local_288.begin.x * -8
                                       + local_2a0)) * local_e8 +
                             ((*(double *)
                                ((long)local_188.p +
                                lVar6 * 8 +
                                ((long)local_328 - (long)local_188.begin.y) * lVar10 + lVar4) -
                              dVar1) * *(double *)
                                        ((long)local_248.p +
                                        lVar6 * 8 +
                                        ((long)local_328 - (long)local_248.begin.y) *
                                        local_248.jstride * 8 + lVar5) -
                             (dVar1 - *(double *)
                                       ((long)local_188.p +
                                       lVar6 * 8 +
                                       (~local_188.begin.y + (int)lVar16) * lVar10 + lVar4)) *
                             *(double *)
                              ((long)local_248.p +
                              lVar6 * 8 +
                              (lVar16 - local_248.begin.y) * local_248.jstride * 8 + lVar5)) *
                             local_108 +
                             *(double *)
                              ((long)local_148.p +
                              lVar6 * 8 +
                              (lVar16 - local_148.begin.y) * local_148.jstride * 8 +
                              (iVar12 - local_148.begin.z) * local_148.kstride * 8 +
                              (long)local_148.begin.x * -8 + local_2a0) * local_310 * dVar1 +
                             ((*(double *)((long)local_188.p + lVar6 * 8 + lVar17 + lVar4 + 8) -
                              dVar1) * *(double *)((long)local_208.p + lVar6 * 8 + lVar11 + 8) -
                             (dVar1 - local_188.p
                                      [local_188.jstride * lVar15 +
                                       local_188.kstride * (iVar12 - local_188.begin.z) +
                                       local_188.nstride * local_428 +
                                       (long)(((local_354.smallend.vect[0] + -1) - local_188.begin.x
                                              ) + (int)lVar6)]) *
                             *(double *)((long)local_208.p + lVar6 * 8 + lVar11)) * local_f8;
                        lVar6 = lVar6 + 1;
                      } while (uVar13 != (uint)lVar6);
                    }
                    lVar16 = lVar16 + 1;
                  } while (local_354.bigend.vect[1] + 1U != (int)lVar16);
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 != local_354.bigend.vect[2] + 1U);
            }
            local_428 = local_428 + 1;
            local_2f8 = local_2f8 + 8;
          } while (local_428 != local_300);
        }
      }
      else {
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::IArrayBox> *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&local_90);
        if (0 < (int)uVar3) {
          local_470 = 0;
          do {
            iVar12 = local_354.smallend.vect[2];
            if (local_354.smallend.vect[2] <= local_354.bigend.vect[2]) {
              do {
                if (local_354.smallend.vect[1] <= local_354.bigend.vect[1]) {
                  lVar4 = (long)iVar12;
                  lVar10 = (long)local_354.smallend.vect[1];
                  do {
                    if (local_354.smallend.vect[0] <= local_354.bigend.vect[0]) {
                      local_328 = local_148.p +
                                  (lVar10 - local_148.begin.y) * local_148.jstride +
                                  (lVar4 - local_148.begin.z) * local_148.kstride;
                      local_338 = local_188.p + (lVar10 - local_188.begin.y) * local_188.jstride;
                      lVar11 = (lVar10 - local_208.begin.y) * local_208.jstride;
                      lVar14 = (lVar4 - local_208.begin.z) * local_208.kstride;
                      lVar15 = (lVar4 - local_248.begin.z) * local_248.kstride;
                      lVar17 = (iVar12 - local_188.begin.z) * local_188.kstride;
                      lVar9 = (lVar10 - local_1c8.begin.y) * local_1c8.jstride;
                      lVar7 = (lVar4 - local_1c8.begin.z) * local_1c8.kstride;
                      lVar8 = local_188.nstride * local_470;
                      lVar16 = (lVar10 - local_288.begin.y) * local_288.jstride;
                      lVar5 = (long)local_354.smallend.vect[0];
                      do {
                        if (local_d0.p
                            [(lVar4 - local_d0.begin.z) * local_d0.kstride +
                             (lVar10 - local_d0.begin.y) * local_d0.jstride +
                             (lVar5 - local_d0.begin.x)] == 0) {
                          local_1c8.p
                          [lVar9 + lVar7 + local_1c8.nstride * local_470 +
                                           (lVar5 - local_1c8.begin.x)] = 0.0;
                        }
                        else {
                          lVar6 = lVar5 - local_188.begin.x;
                          dVar1 = local_338[lVar6 + lVar17 + lVar8];
                          local_1c8.p
                          [lVar9 + lVar7 + local_1c8.nstride * local_470 +
                                           (lVar5 - local_1c8.begin.x)] =
                               ((local_338[lVar6 + ((iVar12 + 1) - local_188.begin.z) *
                                                   local_188.kstride + lVar8] - dVar1) *
                                local_288.p
                                [lVar16 + (lVar5 - local_288.begin.x) +
                                          ((iVar12 + 1) - local_288.begin.z) * local_288.kstride +
                                          local_288.nstride * local_470] -
                               (dVar1 - local_338[lVar6 + (~local_188.begin.z + iVar12) *
                                                          local_188.kstride + lVar8]) *
                               local_288.p
                               [lVar16 + (lVar5 - local_288.begin.x) +
                                         (iVar12 - local_288.begin.z) * local_288.kstride +
                                         local_288.nstride * local_470]) * local_e8 +
                               ((local_188.p
                                 [((lVar10 + 1) - (long)local_188.begin.y) * local_188.jstride +
                                  lVar17 + lVar8 + lVar6] - dVar1) *
                                local_248.p
                                [((lVar10 + 1) - (long)local_248.begin.y) * local_248.jstride +
                                 lVar15 + local_248.nstride * local_470 +
                                          (lVar5 - local_248.begin.x)] -
                               (dVar1 - local_188.p
                                        [(~local_188.begin.y + (int)lVar10) * local_188.jstride +
                                         lVar17 + lVar8 + lVar6]) *
                               local_248.p
                               [(lVar10 - local_248.begin.y) * local_248.jstride +
                                lVar15 + local_248.nstride * local_470 + (lVar5 - local_248.begin.x)
                               ]) * local_108 +
                               local_328[lVar5 - local_148.begin.x] * local_310 * dVar1 +
                               ((local_338[lVar17 + lVar8 + ((lVar5 + 1) - (long)local_188.begin.x)]
                                - dVar1) *
                                local_208.p
                                [lVar11 + lVar14 + local_208.nstride * local_470 +
                                                   ((lVar5 + 1) - (long)local_208.begin.x)] -
                               (dVar1 - local_338[lVar17 + lVar8 + ((int)lVar5 + ~local_188.begin.x)
                                                 ]) *
                               local_208.p
                               [lVar11 + lVar14 + local_208.nstride * local_470 +
                                                  (lVar5 - local_208.begin.x)]) * local_f8;
                        }
                        lVar5 = lVar5 + 1;
                      } while (local_354.bigend.vect[0] + 1 != (int)lVar5);
                    }
                    lVar10 = lVar10 + 1;
                  } while (local_354.bigend.vect[1] + 1U != (int)lVar10);
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 != local_354.bigend.vect[2] + 1U);
            }
            local_470 = local_470 + 1;
          } while (local_470 != local_300);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLABecLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLABecLaplacian::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && out.isFusingCandidate()) {
        const auto& xma = in.const_arrays();
        const auto& yma = out.arrays();
        const auto& ama = acoef.arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx_os(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                   AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                   osmma[box_no], dxinv, ascalar, bscalar);
            });
        } else {
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
            });
        }
        Gpu::streamSynchronize();
    }